

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_examples.cpp
# Opt level: O1

void density_tests::func(size_t i_size)

{
  lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *this;
  long lVar1;
  void *i_block;
  void *new_block;
  undefined4 *i_block_00;
  long *in_FS_OFFSET;
  lifo_buffer buffer_2;
  lifo_buffer buffer_1;
  lifo_array<int> other_numbers;
  lifo_buffer local_40;
  lifo_buffer local_30;
  LifoArrayImpl<int,_false> local_20;
  
  density::lifo_buffer::lifo_buffer(&local_30,i_size);
  if (local_30.m_size != i_size) {
    __assert_fail("buffer_1.size() == i_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                  ,0x2c,"void density_tests::func(size_t)");
  }
  density::detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
  lVar1 = *in_FS_OFFSET;
  i_block = (void *)in_FS_OFFSET[-0x19];
  local_40.m_size = 0;
  local_40.m_data = i_block;
  density::detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
  this = (lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *)(lVar1 + -200);
  i_block_00 = (undefined4 *)
               density::lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::reallocate
                         (this,i_block,0,8);
  local_40.m_size = 4;
  *i_block_00 = 5;
  local_40.m_data = i_block_00;
  density::detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
  local_40.m_data =
       density::lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::reallocate
                 (this,i_block_00,8,0x50);
  local_40.m_size = 0x50;
  if (*local_40.m_data == 5) {
    density::detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
    local_20.m_elements = (int *)in_FS_OFFSET[-0x19];
    if (&DAT_0000ffef <
        (undefined1 *)
        ((long)local_20.m_elements + (0x20 - ((ulong)local_20.m_elements & 0xffffffffffff0000)))) {
      local_20.m_elements =
           (int *)density::lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::
                  allocate_slow_path(this,0x20);
    }
    else {
      in_FS_OFFSET[-0x19] = (long)(local_20.m_elements + 8);
    }
    local_20.m_size = 7;
    density::detail::LifoArrayImpl<int,_false>::~LifoArrayImpl(&local_20);
    density::lifo_buffer::~lifo_buffer(&local_40);
    density::lifo_buffer::~lifo_buffer(&local_30);
    return;
  }
  __assert_fail("*static_cast<int *>(mem) == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                ,0x36,"void density_tests::func(size_t)");
}

Assistant:

void func(size_t i_size)
    {
        using namespace density;

        lifo_buffer buffer_1(i_size);
        assert(buffer_1.size() == i_size);

        lifo_buffer buffer_2; // now buffer_1 can't be resized until buffer_2 is destroyed
        assert(buffer_2.size() == 0);

        auto mem = buffer_2.resize(sizeof(int));
        assert(mem == buffer_2.data());
        *static_cast<int *>(mem) = 5;

        mem = buffer_2.resize(sizeof(int) * 20);
        assert(*static_cast<int *>(mem) == 5);

        lifo_array<int> other_numbers(7);
        // buffer_2.resize(20); <---- violation of the lifo constraint, other_numbers is more recent!
    }